

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Probe.cpp
# Opt level: O2

void __thiscall helics::apps::Probe::runProbe(Probe *this)

{
  element_type *peVar1;
  long lVar2;
  _func_int *p_Var3;
  bool bVar4;
  size_type *psVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  double dVar6;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  string_view message_00;
  undefined1 local_a8 [32];
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> message;
  Core *local_80;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_60 [2];
  void *local_40;
  void *__buf;
  
  peVar1 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar2 = *(long *)(&(peVar1->super_ValueFederate).field_0x28 +
                   (long)(peVar1->super_ValueFederate)._vptr_ValueFederate[-3]);
  dVar6 = (double)(lVar2 % 1000000000) * 1e-09 + (double)(lVar2 / 1000000000);
  while( true ) {
    bVar4 = Endpoint::hasMessage(&this->endpoint);
    if (!bVar4) break;
    Endpoint::getMessage((Endpoint *)&message);
    peVar1 = (this->super_App).fed.
             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var3 = (peVar1->super_ValueFederate)._vptr_ValueFederate[-3];
    local_40 = *(void **)((long)message._M_t.
                                super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                                .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x50
                         );
    aaStack_60[1]._8_8_ =
         *(undefined8 *)
          ((long)message._M_t.
                 super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
                 super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                 super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x60);
    local_68 = *(size_type *)
                ((long)message._M_t.
                       super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                       .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x90);
    aaStack_60[0]._0_8_ =
         *(size_type *)
          ((long)message._M_t.
                 super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
                 super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                 super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x98);
    fmt.size_ = 0xdad;
    fmt.data_ = (char *)0x20;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&local_68;
    aaStack_60[0]._8_8_ = dVar6;
    ::fmt::v11::vformat_abi_cxx11_
              ((string *)local_a8,(v11 *)"Message from {} at Time {}: [{}]",fmt,args);
    message_00._M_str = (char *)local_a8._0_8_;
    message_00._M_len = local_a8._8_8_;
    Federate::logInfoMessage
              ((Federate *)((long)&(peVar1->super_ValueFederate)._vptr_ValueFederate + (long)p_Var3)
               ,message_00);
    std::__cxx11::string::~string((string *)local_a8);
    this->messagesReceived = this->messagesReceived + 1;
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr(&message);
  }
  peVar1 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  psVar5 = (size_type *)
           (&(peVar1->super_ValueFederate).field_0x78 +
           (long)(peVar1->super_ValueFederate)._vptr_ValueFederate[-3]);
  local_68 = *psVar5;
  aaStack_60[0]._0_8_ = psVar5[1];
  psVar5 = &local_68;
  fmt_00.size_ = 0xad;
  fmt_00.data_ = (char *)0x17;
  args_00.field_1.values_ = in_R9.values_;
  args_00.desc_ = (unsigned_long_long)psVar5;
  aaStack_60[0]._8_8_ = dVar6;
  ::fmt::v11::vformat_abi_cxx11_((string *)&message,(v11 *)"message from {},time {}",fmt_00,args_00)
  ;
  local_a8._8_8_ =
       message._M_t.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
       _M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
       super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
  local_a8._16_8_ = 0;
  local_a8._24_8_ = 0;
  Endpoint::send(&this->endpoint,(int)local_a8,__buf,(size_t)local_80,(int)psVar5);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 0x18));
  std::__cxx11::string::~string((string *)&message);
  return;
}

Assistant:

void Probe::runProbe()
{
    auto ctime = fed->getCurrentTime();
    while (endpoint.hasMessage()) {
        auto message = endpoint.getMessage();
        fed->logInfoMessage(fmt::format("Message from {} at Time {}: [{}]",
                                        message->source,
                                        static_cast<double>(ctime),
                                        message->to_string()));
        ++messagesReceived;
    }
    endpoint.send(
        fmt::format("message from {},time {}", fed->getName(), static_cast<double>(ctime)));
}